

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,
          basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *other)

{
  buffer<unsigned_int> *buf_data;
  size_t sVar1;
  size_t buf_capacity;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  size_t capacity;
  size_t size;
  uint *data;
  allocator<unsigned_int> *other_alloc;
  allocator<unsigned_int> *this_alloc;
  size_t in_stack_ffffffffffffffa8;
  buffer<unsigned_int> *in_stack_ffffffffffffffb0;
  uint *__last;
  
  buf_data = (buffer<unsigned_int> *)internal::buffer<unsigned_int>::data(in_RSI);
  sVar1 = internal::buffer<unsigned_int>::size(in_RSI);
  buf_capacity = internal::buffer<unsigned_int>::capacity(in_RSI);
  if (buf_data == in_RSI + 1) {
    internal::buffer<unsigned_int>::set(in_RDI,(uint *)(in_RDI + 1),buf_capacity);
    in_stack_ffffffffffffffb0 = in_RSI + 1;
    __last = (uint *)((long)&in_RSI[1]._vptr_buffer + sVar1 * 4);
    internal::make_checked<unsigned_int>((uint *)(in_RDI + 1),buf_capacity);
    std::uninitialized_copy<unsigned_int*,unsigned_int*>
              ((uint *)in_RDI,__last,(uint *)in_stack_ffffffffffffffb0);
  }
  else {
    internal::buffer<unsigned_int>::set(in_RDI,(uint *)buf_data,buf_capacity);
    internal::buffer<unsigned_int>::set(in_RSI,(uint *)(in_RSI + 1),0);
  }
  internal::buffer<unsigned_int>::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }